

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O0

int __thiscall
TPZSBMatrix<std::complex<float>_>::Subst_Diag
          (TPZSBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  long lVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t j;
  int64_t k;
  int64_t size;
  char *in_stack_00000188;
  char *in_stack_00000190;
  TPZBaseMatrix *__x;
  undefined1 local_30 [8];
  long local_28;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar2 != lVar3) || ((char)in_RDI[3] == '\0')) {
    TPZMatrix<std::complex<float>_>::Error(in_stack_00000190,in_stack_00000188);
  }
  local_18 = in_RDI[8] + 1;
  local_20 = 0;
  while( true ) {
    lVar3 = local_20;
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar4 <= lVar3) break;
    local_28 = 0;
    while( true ) {
      lVar3 = local_28;
      iVar2 = TPZBaseMatrix::Cols(local_10);
      lVar1 = local_20;
      lVar4 = local_28;
      if (iVar2 <= lVar3) break;
      __x = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])();
      (**(code **)(*in_RDI + 0x120))(in_RDI,local_20);
      std::operator/((complex<float> *)__x,(complex<float> *)0x13d7319);
      (*(__x->super_TPZSavable)._vptr_TPZSavable[0x23])(__x,lVar1,lVar4,local_30);
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

int TPZSBMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const
{
    
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
       this->Error(__PRETTY_FUNCTION__,"Subst_Diag-> uncompatible matrices") ;
    
    
    int64_t size = fBand + 1;
    for ( int64_t k = 0; k < this->Dim(); k++ )
        for ( int64_t j = 0; j < B->Cols(); j++ )
            B->PutVal( k, j, B->GetVal( k, j) / GetVal(k,k) );
    
    return( 1 );
}